

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2edge_distances.cc
# Opt level: O0

bool S2::AlwaysUpdateMinInteriorDistance<false>
               (S2Point *x,S2Point *a,S2Point *b,double xa2,double xb2,S1ChordAngle *min_dist)

{
  S1ChordAngle *pSVar1;
  bool bVar2;
  ostream *poVar3;
  double *pdVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  S1ChordAngle SVar8;
  bool local_159;
  double dist2;
  double qr;
  S2Point cx;
  double x_dot_c2;
  double x_dot_c;
  double c2;
  S2Point c;
  S2LogMessage local_d8;
  S2LogMessageVoidify local_c1;
  D local_c0;
  byte local_a1;
  S2LogMessage local_a0;
  S2LogMessageVoidify local_89;
  D local_88;
  byte local_59;
  S2LogMessage local_58;
  S2LogMessageVoidify local_41;
  S1ChordAngle *local_40;
  S1ChordAngle *min_dist_local;
  double xb2_local;
  double xa2_local;
  S2Point *b_local;
  S2Point *a_local;
  S2Point *x_local;
  
  local_40 = min_dist;
  min_dist_local = (S1ChordAngle *)xb2;
  xb2_local = xa2;
  xa2_local = (double)b;
  b_local = a;
  a_local = x;
  bVar2 = IsUnitLength(x);
  local_59 = 0;
  local_159 = false;
  if (bVar2) {
    bVar2 = IsUnitLength(b_local);
    local_159 = false;
    if (bVar2) {
      local_159 = IsUnitLength((S2Point *)xa2_local);
    }
  }
  if (((local_159 ^ 0xffU) & 1) != 0) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_58,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2edge_distances.cc"
               ,0x55,kFatal,(ostream *)&std::cerr);
    local_59 = 1;
    poVar3 = S2LogMessage::stream(&local_58);
    poVar3 = std::operator<<(poVar3,
                             "Check failed: S2::IsUnitLength(x) && S2::IsUnitLength(a) && S2::IsUnitLength(b) "
                            );
    S2LogMessageVoidify::operator&(&local_41,poVar3);
  }
  dVar6 = xb2_local;
  if ((local_59 & 1) != 0) {
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_58);
  }
  util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator-
            (&local_88,(BasicVector<Vector3,_double,_3UL> *)a_local,b_local);
  dVar5 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::Norm2
                    ((BasicVector<Vector3,_double,_3UL> *)&local_88);
  local_a1 = 0;
  if (dVar6 != dVar5) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_a0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2edge_distances.cc"
               ,0x56,kFatal,(ostream *)&std::cerr);
    local_a1 = 1;
    poVar3 = S2LogMessage::stream(&local_a0);
    poVar3 = std::operator<<(poVar3,"Check failed: (xa2) == ((x-a).Norm2()) ");
    S2LogMessageVoidify::operator&(&local_89,poVar3);
  }
  pSVar1 = min_dist_local;
  if ((local_a1 & 1) != 0) {
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_a0);
  }
  util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator-
            (&local_c0,(BasicVector<Vector3,_double,_3UL> *)a_local,(D *)xa2_local);
  dVar6 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::Norm2
                    ((BasicVector<Vector3,_double,_3UL> *)&local_c0);
  if ((double)pSVar1 != dVar6) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_d8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2edge_distances.cc"
               ,0x57,kFatal,(ostream *)&std::cerr);
    poVar3 = S2LogMessage::stream(&local_d8);
    poVar3 = std::operator<<(poVar3,"Check failed: (xb2) == ((x-b).Norm2()) ");
    S2LogMessageVoidify::operator&(&local_c1,poVar3);
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_d8);
  }
  pdVar4 = std::max<double>(&xb2_local,(double *)&min_dist_local);
  dVar6 = *pdVar4;
  pdVar4 = std::min<double>(&xb2_local,(double *)&min_dist_local);
  dVar5 = *pdVar4;
  util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator-
            ((D *)(c.c_ + 2),(BasicVector<Vector3,_double,_3UL> *)b_local,(D *)xa2_local);
  dVar7 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::Norm2
                    ((BasicVector<Vector3,_double,_3UL> *)(c.c_ + 2));
  if (dVar6 < dVar5 + dVar7) {
    RobustCrossProd((Vector3_d *)&c2,b_local,(S2Point *)xa2_local);
    dVar6 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::Norm2
                      ((BasicVector<Vector3,_double,_3UL> *)&c2);
    dVar5 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::DotProd
                      ((BasicVector<Vector3,_double,_3UL> *)a_local,(D *)&c2);
    cx.c_[2] = dVar5 * dVar5;
    dVar7 = S1ChordAngle::length2(local_40);
    if (dVar5 * dVar5 <= dVar6 * dVar7) {
      Vector3<double>::CrossProd((Vector3<double> *)&qr,(Vector3<double> *)&c2,a_local);
      dVar5 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::DotProd
                        ((BasicVector<Vector3,_double,_3UL> *)b_local,(D *)&qr);
      if ((0.0 <= dVar5) ||
         (dVar5 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::DotProd
                            ((BasicVector<Vector3,_double,_3UL> *)xa2_local,(D *)&qr), dVar5 <= 0.0)
         ) {
        x_local._7_1_ = false;
      }
      else {
        dVar5 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::Norm2
                          ((BasicVector<Vector3,_double,_3UL> *)&qr);
        dVar5 = sqrt(dVar5 / dVar6);
        dVar6 = cx.c_[2] / dVar6 + (1.0 - dVar5) * (1.0 - dVar5);
        dVar5 = S1ChordAngle::length2(local_40);
        if (dVar6 < dVar5) {
          SVar8 = S1ChordAngle::FromLength2(dVar6);
          local_40->length2_ = SVar8.length2_;
          x_local._7_1_ = true;
        }
        else {
          x_local._7_1_ = false;
        }
      }
    }
    else {
      x_local._7_1_ = false;
    }
  }
  else {
    x_local._7_1_ = false;
  }
  return x_local._7_1_;
}

Assistant:

inline bool AlwaysUpdateMinInteriorDistance(
    const S2Point& x, const S2Point& a, const S2Point& b,
    double xa2, double xb2, S1ChordAngle* min_dist) {
  S2_DCHECK(S2::IsUnitLength(x) && S2::IsUnitLength(a) && S2::IsUnitLength(b));
  S2_DCHECK_EQ(xa2, (x-a).Norm2());
  S2_DCHECK_EQ(xb2, (x-b).Norm2());

  // The closest point on AB could either be one of the two vertices (the
  // "vertex case") or in the interior (the "interior case").  Let C = A x B.
  // If X is in the spherical wedge extending from A to B around the axis
  // through C, then we are in the interior case.  Otherwise we are in the
  // vertex case.
  //
  // Check whether we might be in the interior case.  For this to be true, XAB
  // and XBA must both be acute angles.  Checking this condition exactly is
  // expensive, so instead we consider the planar triangle ABX (which passes
  // through the sphere's interior).  The planar angles XAB and XBA are always
  // less than the corresponding spherical angles, so if we are in the
  // interior case then both of these angles must be acute.
  //
  // We check this by computing the squared edge lengths of the planar
  // triangle ABX, and testing acuteness using the law of cosines:
  //
  //             max(XA^2, XB^2) < min(XA^2, XB^2) + AB^2
  //
  if (max(xa2, xb2) >= min(xa2, xb2) + (a-b).Norm2()) {
    return false;
  }
  // The minimum distance might be to a point on the edge interior.  Let R
  // be closest point to X that lies on the great circle through AB.  Rather
  // than computing the geodesic distance along the surface of the sphere,
  // instead we compute the "chord length" through the sphere's interior.
  // If the squared chord length exceeds min_dist.length2() then we can
  // return "false" immediately.
  //
  // The squared chord length XR^2 can be expressed as XQ^2 + QR^2, where Q
  // is the point X projected onto the plane through the great circle AB.
  // The distance XQ^2 can be written as (X.C)^2 / |C|^2 where C = A x B.
  // We ignore the QR^2 term and instead use XQ^2 as a lower bound, since it
  // is faster and the corresponding distance on the Earth's surface is
  // accurate to within 1% for distances up to about 1800km.
  S2Point c = S2::RobustCrossProd(a, b);
  double c2 = c.Norm2();
  double x_dot_c = x.DotProd(c);
  double x_dot_c2 = x_dot_c * x_dot_c;
  if (!always_update && x_dot_c2 > c2 * min_dist->length2()) {
    // The closest point on the great circle AB is too far away.  We need to
    // test this using ">" rather than ">=" because the actual minimum bound
    // on the distance is (x_dot_c2 / c2), which can be rounded differently
    // than the (more efficient) multiplicative test above.
    return false;
  }
  // Otherwise we do the exact, more expensive test for the interior case.
  // This test is very likely to succeed because of the conservative planar
  // test we did initially.
  S2Point cx = c.CrossProd(x);
  if (a.DotProd(cx) >= 0 || b.DotProd(cx) <= 0) {
    return false;
  }
  // Compute the squared chord length XR^2 = XQ^2 + QR^2 (see above).
  // This calculation has good accuracy for all chord lengths since it
  // is based on both the dot product and cross product (rather than
  // deriving one from the other).  However, note that the chord length
  // representation itself loses accuracy as the angle approaches Pi.
  double qr = 1 - sqrt(cx.Norm2() / c2);
  double dist2 = (x_dot_c2 / c2) + (qr * qr);
  if (!always_update && dist2 >= min_dist->length2()) {
    return false;
  }
  *min_dist = S1ChordAngle::FromLength2(dist2);
  return true;
}